

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O3

void device_init(char *cfg)

{
  bool bVar1;
  Sphere *pSVar2;
  bool bVar3;
  
  embree::sphereIntersectFuncPtr = embree::sphereIntersectFunc;
  embree::data = 0;
  DAT_002cad58 = (RTCScene)0x0;
  _DAT_002cad60 = 0;
  DAT_002cad68 = (Sphere *)0x0;
  _DAT_002cad70 = 0;
  DAT_002cad74 = 1;
  _DAT_002cad78 = 0;
  DAT_002cad80._0_4_ = 0;
  DAT_002cad80._4_4_ = 0;
  DAT_002cad88 = 0;
  _DAT_002cad8c = 0;
  _DAT_002cada0 = 0;
  uRam00000000002cada8 = 0;
  _DAT_002cadb0 = 0;
  uRam00000000002cadb8 = 0;
  _DAT_002cadc0 = 0;
  uRam00000000002cadc8 = 0;
  _DAT_002cadd0 = 0;
  uRam00000000002cadd8 = 0;
  embree::g_scene = rtcNewScene(g_device);
  embree::data = embree::g_scene;
  DAT_002cad58 = (RTCScene)rtcNewScene(g_device);
  pSVar2 = embree::createAnalyticalSpheres(DAT_002cad58,1);
  DAT_002cad68 = pSVar2;
  *(undefined8 *)&(pSVar2->p).field_0 = 0;
  *(undefined8 *)((long)&(pSVar2->p).field_0 + 8) = 0;
  DAT_002cad68->r = 1.0;
  rtcCommitScene(DAT_002cad58);
  embree::g_instance_linear_0 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_linear_1 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_quaternion_0 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_quaternion_1 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(embree::g_instance_linear_0,DAT_002cad58);
  rtcSetGeometryInstancedScene(embree::g_instance_linear_1,DAT_002cad58);
  rtcSetGeometryInstancedScene(embree::g_instance_quaternion_0,DAT_002cad58);
  rtcSetGeometryInstancedScene(embree::g_instance_quaternion_1,DAT_002cad58);
  embree::updateTransformation();
  bVar1 = true;
  do {
    bVar3 = bVar1;
    rtcAttachGeometry(embree::data,embree::g_instance_linear_0);
    rtcAttachGeometry(embree::data,embree::g_instance_linear_1);
    rtcAttachGeometry(embree::data,embree::g_instance_quaternion_0);
    rtcAttachGeometry(embree::data,embree::g_instance_quaternion_1);
    bVar1 = false;
  } while (bVar3);
  rtcReleaseGeometry(embree::g_instance_linear_0);
  rtcReleaseGeometry(embree::g_instance_linear_1);
  rtcReleaseGeometry(embree::g_instance_quaternion_0);
  rtcReleaseGeometry(embree::g_instance_quaternion_1);
  rtcCommitGeometry(embree::g_instance_linear_0);
  rtcCommitGeometry(embree::g_instance_linear_1);
  rtcCommitGeometry(embree::g_instance_quaternion_0);
  rtcCommitGeometry(embree::g_instance_quaternion_1);
  rtcCommitScene(embree::data);
  _DAT_002cad60 = rtcGetSceneTraversable(embree::data);
  return;
}

Assistant:

void device_init (char* cfg)
{
  sphereIntersectFuncPtr = GET_FUNCTION_POINTER(sphereIntersectFunc);
  
  /* create scene */
  TutorialData_Constructor(&data);
  g_scene = data.g_scene = rtcNewScene(g_device);

  /* create scene with 4 analytical spheres */
  data.g_scene0 = rtcNewScene(g_device);
  data.g_spheres = createAnalyticalSpheres(data.g_scene0, 1);
  data.g_spheres[0].p = Vec3fa(0, 0, 0);
  data.g_spheres[0].r = 1.0f;
  rtcCommitScene(data.g_scene0);

  // attach multiple times otherwise Embree will optimize and not use
  // internal instancing (magic!)
  g_instance_linear_0 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_linear_1 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_quaternion_0 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_quaternion_1 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance_linear_0, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_linear_1, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_quaternion_0, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_quaternion_1, data.g_scene0);
  updateTransformation();
  for (int i = 0; i < 2; ++i)
  {
    rtcAttachGeometry(data.g_scene, g_instance_linear_0);
    rtcAttachGeometry(data.g_scene, g_instance_linear_1);
    rtcAttachGeometry(data.g_scene, g_instance_quaternion_0);
    rtcAttachGeometry(data.g_scene, g_instance_quaternion_1);
  }
  rtcReleaseGeometry(g_instance_linear_0);
  rtcReleaseGeometry(g_instance_linear_1);
  rtcReleaseGeometry(g_instance_quaternion_0);
  rtcReleaseGeometry(g_instance_quaternion_1);
  rtcCommitGeometry(g_instance_linear_0);
  rtcCommitGeometry(g_instance_linear_1);
  rtcCommitGeometry(g_instance_quaternion_0);
  rtcCommitGeometry(g_instance_quaternion_1);

  rtcCommitScene (data.g_scene);
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}